

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btTranslationalLimitMotor2::testLimitValue
          (btTranslationalLimitMotor2 *this,int limitIndex,btScalar test_value)

{
  float fVar1;
  float fVar2;
  btScalar *pbVar3;
  int in_ESI;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btScalar hiLimit;
  btScalar loLimit;
  
  pbVar3 = btVector3::operator_cast_to_float_(in_RDI);
  fVar1 = pbVar3[in_ESI];
  pbVar3 = btVector3::operator_cast_to_float_(in_RDI + 1);
  fVar2 = pbVar3[in_ESI];
  if (fVar1 <= fVar2) {
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xe].m_floats + 1));
      pbVar3[in_ESI] = in_XMM0_Da - fVar1;
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xf].m_floats + 1));
      pbVar3[in_ESI] = in_XMM0_Da - fVar2;
      in_RDI[0x11].m_floats[(long)in_ESI + 1] = 5.60519e-45;
    }
    else {
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xe].m_floats + 1));
      pbVar3[in_ESI] = in_XMM0_Da - fVar1;
      in_RDI[0x11].m_floats[(long)in_ESI + 1] = 4.2039e-45;
    }
  }
  else {
    pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xe].m_floats + 1));
    pbVar3[in_ESI] = 0.0;
    in_RDI[0x11].m_floats[(long)in_ESI + 1] = 0.0;
  }
  return;
}

Assistant:

void btTranslationalLimitMotor2::testLimitValue(int limitIndex, btScalar test_value)
{
	btScalar loLimit = m_lowerLimit[limitIndex];
	btScalar hiLimit = m_upperLimit[limitIndex];
	if(loLimit > hiLimit) {
		m_currentLimitError[limitIndex] = 0;
		m_currentLimit[limitIndex] = 0;
	}
	else if(loLimit == hiLimit) {
		m_currentLimitError[limitIndex] = test_value - loLimit;
		m_currentLimit[limitIndex] = 3;
	} else {
		m_currentLimitError[limitIndex] = test_value - loLimit;
		m_currentLimitErrorHi[limitIndex] = test_value - hiLimit;
		m_currentLimit[limitIndex] = 4;
	}
}